

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall
BackwardPass::ProcessBailOnNoProfile(BackwardPass *this,Instr *instr,BasicBlock *block)

{
  IRKind IVar1;
  Opnd *this_00;
  BasicBlock *pBVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  bool bVar6;
  OpndKind OVar7;
  bool bVar8;
  ushort uVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  Type pSVar12;
  Type *ppFVar13;
  long lVar14;
  Instr *instr_00;
  uint uVar15;
  TempObjectTracker *this_01;
  Instr *this_02;
  Func **ppFVar16;
  undefined1 local_80 [8];
  Iterator __iter;
  undefined1 local_68 [8];
  Iterator __iter_1;
  Instr *local_50;
  
  if (this->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2085,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar6) goto LAB_003e9fe0;
    *puVar10 = 0;
  }
  if (instr->m_opcode != BailOnNoProfile) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2086,"(instr->m_opcode == Js::OpCode::BailOnNoProfile)",
                       "instr->m_opcode == Js::OpCode::BailOnNoProfile");
    if (!bVar6) goto LAB_003e9fe0;
    *puVar10 = 0;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2087,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar6) goto LAB_003e9fe0;
    *puVar10 = 0;
  }
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2088,"(block)","block");
    if (!bVar6) goto LAB_003e9fe0;
    *puVar10 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if ((this->currentRegion != (Region *)0x0) &&
     ((byte)(this->currentRegion->type - RegionTypeCatch) < 2)) {
    return false;
  }
  this_02 = instr->m_prev;
  if (((this_02->m_kind == InstrKindProfiledLabel) || (this_02->m_kind == InstrKindLabel)) &&
     (((ulong)this_02[1].m_func & 2) != 0)) {
    if (this->tag != BackwardPhase) {
      return false;
    }
    bVar6 = SatisfyMarkTempObjectsConditions(this);
    if (!bVar6) {
      return false;
    }
    this_01 = block->tempObjectTracker;
  }
  else {
    __iter_1.current = (NodeBase *)&instr->m_prev;
    __iter.current = (NodeBase *)this;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_50 = (Instr *)0x0;
    while ((6 < this_02->m_kind || ((0x68U >> (this_02->m_kind & 0x1f) & 1) == 0))) {
      bVar6 = IR::Instr::DontHoistBailOnNoProfileAboveInGeneratorFunction(this_02);
      if ((bVar6) && (bVar6 = local_50 != (Instr *)0x0, local_50 = this_02, bVar6)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20ab,"(insertionPointForGenerator == nullptr)",
                           "insertionPointForGenerator == nullptr");
        if (!bVar6) goto LAB_003e9fe0;
        *puVar10 = 0;
      }
      uVar15 = this_02->m_opcode - 0x248;
      if (((uVar15 < 7) && ((0x67U >> (uVar15 & 0x1f) & 1) != 0)) ||
         ((bVar6 = OpCodeAttr::CallInstr(this_02->m_opcode), bVar6 &&
          (this_02->m_prev->m_opcode != BailOnNoProfile)))) break;
      this_02 = this_02->m_prev;
    }
    if ((this_02->m_kind != InstrKindLabel) && (this_02->m_kind != InstrKindProfiledLabel)) {
LAB_003e9f7d:
      BasicBlock::RemoveInstr(block,instr);
      return true;
    }
    pIVar11 = IR::Instr::GetNextRealInstrOrLabel(this_02);
    if ((pIVar11->m_opcode == Ld_A) &&
       (OVar7 = IR::Opnd::GetKind(pIVar11->m_dst), OVar7 == OpndKindReg)) {
      this_00 = pIVar11->m_dst;
      OVar7 = IR::Opnd::GetKind(this_00);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) {
LAB_003e9fe0:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      if (((ushort)this_00[1].m_valueType.field_0 & 8) != 0) goto LAB_003e9f7d;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      pSVar12 = (__iter_1.current)->next;
      uVar15 = (uint)*(byte *)((long)&pSVar12[7].next + 1);
      __iter_1.current = pSVar12;
      if ((uVar15 < 7) && ((0x68U >> (uVar15 & 0x1f) & 1) != 0)) break;
      if (*(short *)&pSVar12[6].next == 0x237) {
        if (((ulong)pSVar12[7].next & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x20e4,"(!curInstr->HasBailOutInfo())","!curInstr->HasBailOutInfo()");
          if (!bVar6) goto LAB_003e9fe0;
          *puVar10 = 0;
        }
        pSVar12 = __iter_1.current[2].next;
        IR::Instr::Remove((Instr *)pSVar12[3].next);
      }
      __iter_1.current = pSVar12 + 3;
    }
    IR::Instr::Unlink(instr);
    local_80 = (undefined1  [8])&block->predList;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_80;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_003e9c17:
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_003e9fe0;
      *puVar10 = 0;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list != local_80) {
      ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_80);
      pBVar2 = (*ppFVar13)->predBlock;
      if (pBVar2 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20f3,"(pred)","pred");
        if (!bVar6) goto LAB_003e9fe0;
        *puVar10 = 0;
      }
      if (((block->field_0x18 & 4) == 0) || (pBVar2->loop != block->loop)) {
        pIVar11 = pBVar2->firstInstr;
        IVar1 = pIVar11->m_kind;
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar6) goto LAB_003e9fe0;
          *puVar10 = 0;
        }
        if (pIVar11[1].m_src2 != (Opnd *)__iter.current[6].next) goto LAB_003e9f13;
        local_68 = (undefined1  [8])&pBVar2->succList;
        bVar6 = local_50 == (Instr *)0x0;
        __iter_1.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_68;
        do {
          if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar8) goto LAB_003e9fe0;
            *puVar10 = 0;
          }
          __iter_1.list =
               (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          pSVar5 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if ((undefined1  [8])__iter_1.list == local_68) break;
          ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)local_68);
          pBVar3 = (*ppFVar13)->succBlock;
          if (pBVar3 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x2105,"(predSucc)","predSucc");
            if (!bVar8) goto LAB_003e9fe0;
            *puVar10 = 0;
          }
          if (pBVar3 == block) {
            bVar8 = false;
          }
          else {
            bVar8 = (pBVar3->field_0x18 & 0x80) == 0;
            bVar6 = (bool)(bVar6 & (char)pBVar3->field_0x18 >> 7);
          }
          pSVar5 = __iter_1.list;
        } while (!bVar8);
        __iter_1.list = pSVar5;
        if (bVar6 != false) {
          pBVar3 = pBVar2->next;
          ppFVar16 = &pBVar2->func;
          if (pBVar3 != (BasicBlock *)0x0) {
            ppFVar16 = (Func **)&pBVar3->firstInstr;
          }
          lVar14 = 0x18;
          if (pBVar3 == (BasicBlock *)0x0) {
            lVar14 = 0xd0;
          }
          pIVar11 = *(Instr **)((long)&(*ppFVar16)->m_alloc + lVar14);
          instr_00 = IR::Instr::Copy(instr,true);
          IVar1 = pIVar11->m_kind;
          if ((((IVar1 == InstrKindBranch) || (IVar1 == InstrKindExit)) ||
              (pIVar11->m_opcode - 0x23 < 3)) || (pIVar11->m_opcode - 0x173 < 2)) {
            if (pIVar11->m_prev->m_opcode != BailOnNoProfile) {
              if ((IVar1 == InstrKindBranch) && (((ulong)pIVar11[1]._vptr_Instr & 2) == 0)) {
                instr_00->m_func = pIVar11->m_func;
                IR::Instr::InsertBefore(pIVar11,instr_00);
              }
              goto LAB_003e9c17;
            }
          }
          else if (pIVar11->m_opcode != BailOnNoProfile) {
            instr_00->m_func = pIVar11->m_func;
            IR::Instr::InsertAfter(pIVar11,instr_00);
            goto LAB_003e9c17;
          }
          IR::Instr::Free(instr_00);
        }
      }
      goto LAB_003e9c17;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
LAB_003e9f13:
    if (block->number == 0) {
      IR::Instr::Free(instr);
      return true;
    }
    *(byte *)&this_02[1].m_func = *(byte *)&this_02[1].m_func | 0x22;
    instr->m_func = (Func *)__iter_1.current[4].next;
    if (local_50 == (Instr *)0x0) {
      IR::Instr::InsertAfter((Instr *)__iter_1.current,instr);
      uVar9 = (ushort)*(undefined4 *)&block->field_0x18 | 0x80;
    }
    else {
      IR::Instr::InsertAfter(local_50,instr);
      uVar9 = *(ushort *)&block->field_0x18 & 0xff7f;
    }
    *(ushort *)&block->field_0x18 = uVar9;
    if (*(short *)&__iter.current[3].next != 0x62) {
      return false;
    }
    bVar6 = SatisfyMarkTempObjectsConditions((BackwardPass *)__iter.current);
    if (!bVar6) {
      return false;
    }
    this_01 = block->tempObjectTracker;
  }
  ObjectTemp::ProcessBailOnNoProfile(&this_01->super_ObjectTemp,instr);
  return false;
}

Assistant:

bool
BackwardPass::ProcessBailOnNoProfile(IR::Instr *instr, BasicBlock *block)
{
    Assert(this->tag == Js::BackwardPhase);
    Assert(instr->m_opcode == Js::OpCode::BailOnNoProfile);
    Assert(!instr->HasBailOutInfo());
    AnalysisAssert(block);

    if (this->IsPrePass())
    {
        return false;
    }
    if (this->currentRegion && (this->currentRegion->GetType() == RegionTypeCatch || this->currentRegion->GetType() == RegionTypeFinally))
    {
        return false;
    }

    IR::Instr *curInstr = instr->m_prev;

    if (curInstr->IsLabelInstr() && curInstr->AsLabelInstr()->isOpHelper)
    {
        // Already processed

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }

    // For generator functions, we don't want to move the BailOutOnNoProfile
    // above certain instructions such as GeneratorResumeYield or
    // CreateInterpreterStackFrameForGenerator. This indicates the insertion
    // point for the BailOutOnNoProfile in such cases.
    IR::Instr *insertionPointForGenerator = nullptr;

    // Don't hoist if we see calls with profile data (recursive calls)
    while(!curInstr->StartsBasicBlock())
    {
        if (curInstr->DontHoistBailOnNoProfileAboveInGeneratorFunction())
        {
            Assert(insertionPointForGenerator == nullptr);
            insertionPointForGenerator = curInstr;
        }

        // If a function was inlined, it must have had profile info.
        if (curInstr->m_opcode == Js::OpCode::InlineeEnd || curInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || curInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd
            || curInstr->m_opcode == Js::OpCode::InlineeStart || curInstr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)
        {
            break;
        }
        else if (OpCodeAttr::CallInstr(curInstr->m_opcode))
        {
            if (curInstr->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
            {
                break;
            }
        }
        curInstr = curInstr->m_prev;
    }

    // Didn't get to the top of the block, delete this BailOnNoProfile.
    if (!curInstr->IsLabelInstr())
    {
        block->RemoveInstr(instr);
        return true;
    }

    // Save the head instruction for later use.
    IR::LabelInstr *blockHeadInstr = curInstr->AsLabelInstr();

    // We can't bail in the middle of a "tmp = CmEq s1, s2; BrTrue tmp" turned into a "BrEq s1, s2",
    // because the bailout wouldn't be able to restore tmp.
    IR::Instr *curNext = curInstr->GetNextRealInstrOrLabel();
    IR::Instr *instrNope = nullptr;
    if (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
    {
        block->RemoveInstr(instr);
        return true;
        /*while (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
        {
            // Instead of just giving up, we can be a little trickier. We can instead treat the tmp declaration(s) as a
            // part of the block prefix, and put the bailonnoprofile immediately after them. This has the added benefit
            // that we can still merge up blocks beginning with bailonnoprofile, even if they would otherwise not allow
            // us to, due to the fact that these tmp declarations would be pre-empted by the higher-level bailout.
            instrNope = curNext;
            curNext = curNext->GetNextRealInstrOrLabel();
        }*/
    }

    curInstr = instr->m_prev;

    // Move to top of block (but just below any fgpeeptemp lds).
    while(!curInstr->StartsBasicBlock() && curInstr != instrNope)
    {
        // Delete redundant BailOnNoProfile
        if (curInstr->m_opcode == Js::OpCode::BailOnNoProfile)
        {
            Assert(!curInstr->HasBailOutInfo());
            curInstr = curInstr->m_next;
            curInstr->m_prev->Remove();
        }
        curInstr = curInstr->m_prev;
    }

    if (instr == block->GetLastInstr())
    {
        block->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();

    // Now try to move this up the flowgraph to the predecessor blocks
    FOREACH_PREDECESSOR_BLOCK(pred, block)
    {
        // Don't hoist BailOnNoProfile up past blocks containing GeneratorResumeYield
        bool hoistBailToPred = (insertionPointForGenerator == nullptr);

        if (block->isLoopHeader && pred->loop == block->loop)
        {
            // Skip loop back-edges
            continue;
        }

        if (pred->GetFirstInstr()->AsLabelInstr()->GetRegion() != this->currentRegion)
        {
            break;
        }

        // If all successors of this predecessor start with a BailOnNoProfile, we should be
        // okay to hoist this bail to the predecessor.
        FOREACH_SUCCESSOR_BLOCK(predSucc, pred)
        {
            if (predSucc == block)
            {
                continue;
            }
            if (!predSucc->beginsBailOnNoProfile)
            {
                hoistBailToPred = false;
                break;
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (hoistBailToPred)
        {
            IR::Instr *predInstr = pred->GetLastInstr();
            IR::Instr *instrCopy = instr->Copy();


            if (predInstr->EndsBasicBlock())
            {
                if (predInstr->m_prev->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else if (predInstr->IsBranchInstr() && !predInstr->AsBranchInstr()->m_isSwitchBr)
                {
                    // Don't put a bailout in the middle of a switch dispatch sequence.
                    // The bytecode offsets are not in order, and it would lead to incorrect
                    // bailout info.
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertBefore(instrCopy);
                }
            }
            else
            {
                if (predInstr->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else
                {
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertAfter(instrCopy);
                    pred->SetLastInstr(instrCopy);
                }
            }
        }
    } NEXT_PREDECESSOR_BLOCK;

    // If we have a BailOnNoProfile in the first block, there must have been at least one path out of this block that always throws.
    // Don't bother keeping the bailout in the first block as there are some issues in restoring the ArgIn bytecode registers on bailout
    // and throw case should be rare enough that it won't matter for perf.
    if (block->GetBlockNum() != 0)
    {
        blockHeadInstr->isOpHelper = true;
#if DBG
        blockHeadInstr->m_noHelperAssert = true;
#endif

        instr->m_func = curInstr->m_func;

        if (insertionPointForGenerator != nullptr)
        {
            insertionPointForGenerator->InsertAfter(instr);
            block->beginsBailOnNoProfile = false;
        }
        else
        {
            curInstr->InsertAfter(instr);
            block->beginsBailOnNoProfile = true;
        }

        bool setLastInstr = (curInstr == block->GetLastInstr());
        if (setLastInstr)
        {
            block->SetLastInstr(instr);
        }

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }
    else
    {
        instr->Free();
        return true;
    }
}